

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O2

void * array_realloc(int elem,void *base,int *cur,int cnt)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = array_nextsize(elem,*cur,cnt);
  *cur = iVar1;
  pvVar2 = ev_realloc(base,(long)(iVar1 * elem));
  return pvVar2;
}

Assistant:

ecb_cold
array_realloc (int elem, void *base, int *cur, int cnt)
{
  *cur = array_nextsize (elem, *cur, cnt);
  return ev_realloc (base, elem * *cur);
}